

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error split_sdf_conic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  SDF_Edge *pSVar1;
  SDF_Edge_ *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FT_Error error;
  FT_26D6_Vec cpos [5];
  FT_Error local_8c;
  FT_26D6_Vec local_88;
  undefined8 local_78;
  long lStack_70;
  FT_26D6_Vec local_68;
  int local_58;
  int iStack_54;
  undefined8 local_48;
  long lStack_40;
  
  if (out != (SDF_Edge **)0x0) {
    local_88.x = control_points->x;
    local_88.y = control_points->y;
    lStack_70 = control_points[1].y;
    local_68.y = control_points[2].y;
    iVar4 = (int)(local_88.y + lStack_70);
    iVar3 = (int)(lStack_70 + local_68.y);
    iVar5 = iVar3 / 2;
    local_48 = CONCAT44(-(uint)(iVar5 < 0),iVar5);
    iVar3 = iVar3 + iVar4;
    iVar3 = (int)(((uint)(iVar3 >> 0x1f) >> 0x1e) + iVar3) >> 2;
    _local_58 = CONCAT44(-(uint)(iVar3 < 0),iVar3);
    iVar3 = (int)(local_88.x + control_points[1].x) / 2;
    iVar4 = iVar4 / 2;
    local_78 = CONCAT44(-(uint)(iVar3 < 0),iVar3);
    local_68.x = CONCAT44(-(uint)(iVar4 < 0),iVar4);
    lStack_40 = local_68.y;
    if (max_splits < 3) {
      local_8c = 0;
      if (memory == (FT_Memory)0x0) {
        local_8c = 6;
      }
      else {
        pSVar1 = (SDF_Edge *)ft_mem_qalloc(memory,0x50,&local_8c);
        if (local_8c == 0) {
          pSVar1->edge_type = SDF_EDGE_UNDEFINED;
          *(undefined4 *)&pSVar1->field_0x44 = 0;
          pSVar1->next = (SDF_Edge_ *)0x0;
          (pSVar1->control_b).x = 0;
          (pSVar1->control_b).y = 0;
          (pSVar1->control_a).x = 0;
          (pSVar1->control_a).y = 0;
          (pSVar1->end_pos).x = 0;
          (pSVar1->end_pos).y = 0;
          (pSVar1->start_pos).x = 0;
          (pSVar1->start_pos).y = 0;
          local_8c = 0;
          pSVar2 = (SDF_Edge_ *)ft_mem_qalloc(memory,0x50,&local_8c);
          if (local_8c == 0) {
            pSVar2->edge_type = SDF_EDGE_UNDEFINED;
            *(undefined4 *)&pSVar2->field_0x44 = 0;
            pSVar2->next = (SDF_Edge_ *)0x0;
            (pSVar2->control_b).x = 0;
            (pSVar2->control_b).y = 0;
            (pSVar2->control_a).x = 0;
            (pSVar2->control_a).y = 0;
            (pSVar1->start_pos).x = local_88.x;
            (pSVar1->start_pos).y = local_88.y;
            (pSVar1->end_pos).x = local_68.x;
            (pSVar1->end_pos).y = local_68.y;
            pSVar1->edge_type = SDF_EDGE_LINE;
            (pSVar2->start_pos).x = local_68.x;
            (pSVar2->start_pos).y = local_68.y;
            (pSVar2->end_pos).x = local_48;
            (pSVar2->end_pos).y = lStack_40;
            pSVar2->edge_type = SDF_EDGE_LINE;
            pSVar1->next = pSVar2;
            pSVar2->next = *out;
            *out = pSVar1;
            local_8c = 0;
          }
        }
      }
    }
    else {
      local_8c = split_sdf_conic(memory,&local_88,max_splits >> 1,out);
      if (local_8c == 0) {
        local_8c = split_sdf_conic(memory,&local_68,max_splits >> 1,out);
      }
    }
    return local_8c;
  }
  return 6;
}

Assistant:

static FT_Error
  split_sdf_conic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error     error = FT_Err_Ok;
    FT_26D6_Vec  cpos[5];
    SDF_Edge*    left,*  right;


    if ( !memory || !out  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split conic outline */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];

    split_conic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_conic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_conic( memory, &cpos[2], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left ) );
    FT_CALL( sdf_edge_new( memory, &right ) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[2];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[2];
    right->end_pos   = cpos[4];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }